

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_equal_bitset(array_container_t *container1,bitset_container_t *container2)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  uint16_t r;
  uint64_t t;
  uint64_t w;
  int32_t i;
  int32_t pos;
  ulong local_28;
  int local_20;
  int local_1c;
  _Bool local_1;
  
  if ((*in_RSI == -1) || (*in_RSI == *in_RDI)) {
    local_1c = 0;
    for (local_20 = 0; local_20 < 0x400; local_20 = local_20 + 1) {
      for (local_28 = *(ulong *)(*(long *)(in_RSI + 2) + (long)local_20 * 8); local_28 != 0;
          local_28 = local_28 & (local_28 ^ 0xffffffffffffffff) + 1 ^ local_28) {
        iVar1 = roaring_trailing_zeroes(local_28);
        if (*in_RDI <= local_1c) {
          return false;
        }
        if (*(short *)(*(long *)(in_RDI + 2) + (long)local_1c * 2) !=
            (short)((short)(local_20 << 6) + (short)iVar1)) {
          return false;
        }
        local_1c = local_1c + 1;
      }
    }
    local_1 = local_1c == *in_RDI;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool array_container_equal_bitset(const array_container_t* container1,
                                  const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality != container1->cardinality) {
            return false;
        }
    }
    int32_t pos = 0;
    for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
        uint64_t w = container2->words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            uint16_t r = i * 64 + roaring_trailing_zeroes(w);
            if (pos >= container1->cardinality) {
                return false;
            }
            if (container1->array[pos] != r) {
                return false;
            }
            ++pos;
            w ^= t;
        }
    }
    return (pos == container1->cardinality);
}